

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_be34e2::MkTimeResult::MkTimeResult(MkTimeResult *this,tm *prior)

{
  time_t tVar1;
  tm *in_RSI;
  MkTimeResult *in_RDI;
  tm *in_stack_ffffffffffffffe0;
  bool *pbVar2;
  undefined7 in_stack_ffffffffffffffe8;
  bool bVar3;
  
  memcpy(in_RDI,in_RSI,0x38);
  tVar1 = qMkTime(in_stack_ffffffffffffffe0);
  in_RDI->utcSecs = tVar1;
  pbVar2 = &in_RDI->good;
  bVar3 = true;
  if (in_RDI->utcSecs == -1) {
    bVar3 = meansEnd1969((MkTimeResult *)CONCAT17(1,in_stack_ffffffffffffffe8));
  }
  *pbVar2 = bVar3;
  bVar3 = changed(in_RDI,in_RSI);
  in_RDI->adjusted = bVar3;
  return;
}

Assistant:

explicit MkTimeResult(const struct tm &prior)
    : local(prior), utcSecs(qMkTime(&local)),
      good(utcSecs != maybeError || meansEnd1969()),
      adjusted(changed(prior))
    {}